

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall
SchnorrPubkey_Constructor_Test::~SchnorrPubkey_Constructor_Test
          (SchnorrPubkey_Constructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SchnorrPubkey, Constructor) {
  auto sk_pubkey = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey empty_obj;

  EXPECT_FALSE(empty_obj.IsValid());

  auto sk_obj = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey b256_obj(ByteData256(sk_pubkey.GetData()));

  EXPECT_EQ(sk_pubkey.GetHex(), sk_obj.GetHex());
  EXPECT_EQ(sk_pubkey.GetHex(), b256_obj.GetHex());
  EXPECT_TRUE(sk_obj.IsValid());
  EXPECT_TRUE(b256_obj.IsValid());
  EXPECT_TRUE(sk_obj.Equals(b256_obj));
}